

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcsdump.cc
# Opt level: O1

int main(int argc,char **argv)

{
  FileHeader *this;
  undefined8 uVar1;
  uint64_t uVar2;
  int iVar3;
  int iVar4;
  char *buf;
  runtime_error *prVar5;
  ostream *poVar6;
  int *in_R9;
  ulong __n;
  long lVar7;
  int iVar8;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ifs;
  FileHeader fh;
  Header h;
  PrimaryHeader ph;
  File file;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [56];
  undefined1 local_168 [16];
  _Base_ptr local_158;
  _Base_ptr p_Stack_150;
  size_t local_148;
  char local_13c [4];
  Header local_138;
  string local_100;
  PrimaryHeader local_e0;
  File local_c8;
  
  lVar7 = (long)_optind;
  if (_optind < argc) {
    this = (FileHeader *)(local_1c0 + 0x20);
    local_1c0._12_4_ = argc;
    local_1c0._16_8_ = argv;
    do {
      std::__cxx11::string::string
                ((string *)this,*(char **)(local_1c0._16_8_ + lVar7 * 8),(allocator *)&local_138);
      lrit::File::File(&local_c8,(string *)this);
      if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
        operator_delete((void *)local_1a0._0_8_,CONCAT71(local_1a0._17_7_,local_1a0[0x10]) + 1);
      }
      lrit::getHeader<lrit::PrimaryHeader>(&local_e0,&local_c8.header_,&local_c8.m_);
      uVar2 = local_e0.dataLength;
      local_1c0._24_8_ = lVar7;
      if (local_e0.fileType != 0x82) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 *(char **)(local_1c0._16_8_ + local_1c0._24_8_ * 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," has file type ",0xf);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,(uint)local_e0.fileType);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," (expected: 130)",0x10);
        std::endl<char,std::char_traits<char>>(poVar6);
        exit(1);
      }
      lrit::File::getData((File *)local_1c0);
      iVar8 = (int)(uVar2 + 7 >> 3);
      __n = (ulong)iVar8;
      buf = (char *)operator_new__(__n);
      memset(buf,0,__n);
      std::istream::read((char *)local_1c0._0_8_,(long)buf);
      if ((*(byte *)(local_1c0._0_8_ + *(long *)(*(long *)local_1c0._0_8_ + -0x18) + 0x20) & 5) != 0
         ) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_138.address._0_4_ = 0x1e;
        util::str<char[28],char[89],char[2],int>
                  ((string *)(local_1c0 + 0x20),(util *)"Assertion `*ifs` failed at ",
                   (char (*) [28])
                   "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcsdump.cc"
                   ,(char (*) [89])":",(char (*) [2])&local_138,in_R9);
        std::runtime_error::runtime_error(prVar5,(string *)(local_1c0 + 0x20));
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_1a0._0_8_ = local_1a0 + 0x10;
      local_1a0._8_8_ = (pointer)0x0;
      local_1a0[0x10] = 0;
      local_1a0._40_8_ = local_1a0 + 0x38;
      local_1a0._48_8_ = 0;
      local_168[0] = _S_red;
      local_148 = 0;
      local_158 = (_Base_ptr)0x0;
      p_Stack_150 = (_Base_ptr)0x0;
      iVar3 = dcs::FileHeader::readFrom(this,buf,__n);
      if (iVar3 < 1) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_100._M_dataplus._M_p._0_4_ = 0x24;
        util::str<char[30],char[89],char[2],int>
                  ((string *)&local_138,(util *)"Assertion `rv > 0` failed at ",
                   (char (*) [30])
                   "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcsdump.cc"
                   ,(char (*) [89])":",(char (*) [2])&local_100,in_R9);
        std::runtime_error::runtime_error(prVar5,(string *)&local_138);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      for (; iVar3 < iVar8; iVar3 = iVar3 + iVar4 + local_138.dataLength + 0x21) {
        iVar4 = dcs::Header::readFrom(&local_138,buf + iVar3,(long)(iVar8 - iVar3));
        if (iVar4 < 1) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_13c[0] = '+';
          local_13c[1] = 0;
          local_13c[2] = 0;
          local_13c[3] = 0;
          util::str<char[30],char[89],char[2],int>
                    (&local_100,(util *)"Assertion `rv > 0` failed at ",
                     (char (*) [30])
                     "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcsdump.cc"
                     ,(char (*) [89])":",(char (*) [2])local_13c,in_R9);
          std::runtime_error::runtime_error(prVar5,(string *)&local_100);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      if (iVar3 != iVar8) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_100._M_dataplus._M_p._0_4_ = 0x38;
        util::str<char[39],char[89],char[2],int>
                  ((string *)&local_138,(util *)"Assertion `nread == nbytes` failed at ",
                   (char (*) [39])
                   "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcsdump.cc"
                   ,(char (*) [89])":",(char (*) [2])&local_100,in_R9);
        std::runtime_error::runtime_error(prVar5,(string *)&local_138);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (local_158 != (_Base_ptr)0x0) {
        operator_delete(local_158,local_148 - (long)local_158);
      }
      uVar1 = local_1c0._24_8_;
      if ((undefined1 *)local_1a0._40_8_ != local_1a0 + 0x38) {
        operator_delete((void *)local_1a0._40_8_,CONCAT71(local_168._1_7_,local_168[0]) + 1);
      }
      if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
        operator_delete((void *)local_1a0._0_8_,CONCAT71(local_1a0._17_7_,local_1a0[0x10]) + 1);
      }
      operator_delete__(buf);
      if ((long *)local_1c0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_1c0._0_8_ + 8))();
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_c8.m_._M_t);
      if (local_c8.header_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.header_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c8.header_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.header_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_c8.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.buf_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c8.buf_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.buf_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.file_._M_dataplus._M_p != &local_c8.file_.field_2) {
        operator_delete(local_c8.file_._M_dataplus._M_p,
                        local_c8.file_.field_2._M_allocated_capacity + 1);
      }
      lVar7 = uVar1 + 1;
    } while ((int)lVar7 != local_1c0._12_4_);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  int rv;
  int nread;

  for (int i = optind; i < argc; i++) {
    auto file = lrit::File(argv[i]);
    auto ph = file.getHeader<lrit::PrimaryHeader>();
    if (ph.fileType != 130) {
      std::cerr
        << "File " << argv[i]
        << " has file type " << int(ph.fileType)
        << " (expected: 130)"
        << std::endl;
      exit(1);
    }

    // Read DCS data
    int nbytes = (ph.dataLength + 7) / 8;
    auto ifs = file.getData();
    auto buf = std::make_unique<char[]>(nbytes);
    ifs->read(buf.get(), nbytes);
    ASSERT(*ifs);
    nread = 0;

    // Read DCS file header (container for multiple DCS payloads)
    dcs::FileHeader fh;
    rv = fh.readFrom(buf.get(), nbytes);
    ASSERT(rv > 0);
    nread += rv;

    while (nread < nbytes) {
      // Read DCS header
      dcs::Header h;
      rv = h.readFrom(buf.get() + nread, nbytes - nread);
      ASSERT(rv > 0);
      nread += rv;

      // Skip over actual data
      nread += h.dataLength;

      // Skip 14 characters for time with milliseconds (in DCS format).
      // Skip 1 whitepace.
      // Skip 14 characters for time with milliseconds (in DCS format).
      // Skip 4 bytes (same prelude as prelude to first header)
      nread += 14 + 1 + 14 + 4;
    }

    ASSERT(nread == nbytes);
  }

  return 0;
}